

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerVariables::EnumerateSubVariablesIfAny
          (cmDebuggerVariables *this,array<dap::Variable> *toBeReturned)

{
  pointer psVar1;
  pointer psVar2;
  array<dap::Variable> ret;
  vector<dap::Variable,_std::allocator<dap::Variable>_> local_1a8;
  undefined1 local_190 [272];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined8 local_60;
  string local_58;
  integer local_38;
  
  local_1a8.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = (this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->SubVariables).
                super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    local_190._16_8_ = 0;
    local_190._24_8_ = 0;
    local_190._8_8_ = 0;
    local_190._32_8_ = 0;
    local_190._80_8_ = 0;
    local_190._64_8_ = 0;
    local_190._88_8_ = 0;
    local_190._40_8_ = 0;
    local_190._48_8_ = 0;
    local_190._56_8_ = local_190 + 0x48;
    local_190._72_8_ = 0;
    local_190._0_8_ = local_190 + 0x10;
    GetName_abi_cxx11_((string *)(local_190 + 0x60),
                       (psVar2->
                       super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    local_190._128_8_ = 0;
    local_190._136_8_ = 0;
    dap::optional<dap::VariablePresentationHint>::
    optional<dap::VariablePresentationHint_const&,void>
              ((optional<dap::VariablePresentationHint> *)(local_190 + 0x90),
               (VariablePresentationHint *)(anonymous_namespace)::PrivatePropertyHint);
    if (this->SupportsVariableType == true) {
      dap::optional<std::__cxx11::string>::optional<char_const(&)[11],void>
                ((optional<std::__cxx11::string> *)&local_80,(char (*) [11])"collection");
    }
    else {
      local_80._M_p = (pointer)&local_70;
      local_70._M_allocated_capacity = 0;
      local_70._8_8_ = 0;
      local_78 = 0;
      local_60._0_1_ = false;
      local_60._1_7_ = 0;
    }
    GetValue_abi_cxx11_(&local_58,
                        (psVar2->
                        super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    local_38.val = ((psVar2->
                    super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr)->Id;
    std::vector<dap::Variable,_std::allocator<dap::Variable>_>::emplace_back<dap::Variable>
              (toBeReturned,(Variable *)local_190);
    dap::Variable::~Variable((Variable *)local_190);
  }
  std::vector<dap::Variable,_std::allocator<dap::Variable>_>::~vector(&local_1a8);
  return;
}

Assistant:

void cmDebuggerVariables::EnumerateSubVariablesIfAny(
  dap::array<dap::Variable>& toBeReturned) const
{
  dap::array<dap::Variable> ret;
  for (auto const& variables : SubVariables) {
    toBeReturned.emplace_back(dap::Variable{
      {},
      {},
      {},
      variables->GetName(),
      {},
      PrivatePropertyHint,
      SupportsVariableType ? "collection" : dap::optional<dap::string>(),
      variables->GetValue(),
      variables->GetId() });
  }
}